

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliCopyLZ77Store(ZopfliLZ77Store *source,ZopfliLZ77Store *dest)

{
  size_t sVar1;
  size_t sVar2;
  unsigned_short *puVar3;
  size_t *psVar4;
  ZopfliLZ77Store *in_RSI;
  long *in_RDI;
  size_t dsize;
  size_t llsize;
  size_t i;
  ulong local_18;
  
  sVar1 = CeilDiv(in_RDI[2],0x120);
  sVar2 = CeilDiv(in_RDI[2],0x20);
  ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x152d92);
  ZopfliInitLZ77Store((uchar *)in_RDI[3],in_RSI);
  puVar3 = (unsigned_short *)malloc(in_RDI[2] << 1);
  in_RSI->litlens = puVar3;
  puVar3 = (unsigned_short *)malloc(in_RDI[2] << 1);
  in_RSI->dists = puVar3;
  psVar4 = (size_t *)malloc(in_RDI[2] << 3);
  in_RSI->pos = psVar4;
  puVar3 = (unsigned_short *)malloc(in_RDI[2] << 1);
  in_RSI->ll_symbol = puVar3;
  puVar3 = (unsigned_short *)malloc(in_RDI[2] << 1);
  in_RSI->d_symbol = puVar3;
  psVar4 = (size_t *)malloc(sVar1 * 0x900);
  in_RSI->ll_counts = psVar4;
  psVar4 = (size_t *)malloc(sVar2 << 8);
  in_RSI->d_counts = psVar4;
  if ((in_RSI->litlens == (unsigned_short *)0x0) || (in_RSI->dists == (unsigned_short *)0x0)) {
    exit(-1);
  }
  if (in_RSI->pos == (size_t *)0x0) {
    exit(-1);
  }
  if ((in_RSI->ll_symbol != (unsigned_short *)0x0) && (in_RSI->d_symbol != (unsigned_short *)0x0)) {
    if ((in_RSI->ll_counts != (size_t *)0x0) && (in_RSI->d_counts != (size_t *)0x0)) {
      in_RSI->size = in_RDI[2];
      for (local_18 = 0; local_18 < (ulong)in_RDI[2]; local_18 = local_18 + 1) {
        in_RSI->litlens[local_18] = *(unsigned_short *)(*in_RDI + local_18 * 2);
        in_RSI->dists[local_18] = *(unsigned_short *)(in_RDI[1] + local_18 * 2);
        in_RSI->pos[local_18] = *(size_t *)(in_RDI[4] + local_18 * 8);
        in_RSI->ll_symbol[local_18] = *(unsigned_short *)(in_RDI[5] + local_18 * 2);
        in_RSI->d_symbol[local_18] = *(unsigned_short *)(in_RDI[6] + local_18 * 2);
      }
      for (local_18 = 0; local_18 < sVar1 * 0x120; local_18 = local_18 + 1) {
        in_RSI->ll_counts[local_18] = *(size_t *)(in_RDI[7] + local_18 * 8);
      }
      for (local_18 = 0; local_18 < sVar2 << 5; local_18 = local_18 + 1) {
        in_RSI->d_counts[local_18] = *(size_t *)(in_RDI[8] + local_18 * 8);
      }
      return;
    }
    exit(-1);
  }
  exit(-1);
}

Assistant:

void ZopfliCopyLZ77Store(
    const ZopfliLZ77Store* source, ZopfliLZ77Store* dest) {
  size_t i;
  size_t llsize = ZOPFLI_NUM_LL * CeilDiv(source->size, ZOPFLI_NUM_LL);
  size_t dsize = ZOPFLI_NUM_D * CeilDiv(source->size, ZOPFLI_NUM_D);
  ZopfliCleanLZ77Store(dest);
  ZopfliInitLZ77Store(source->data, dest);
  dest->litlens =
      (unsigned short*)malloc(sizeof(*dest->litlens) * source->size);
  dest->dists = (unsigned short*)malloc(sizeof(*dest->dists) * source->size);
  dest->pos = (size_t*)malloc(sizeof(*dest->pos) * source->size);
  dest->ll_symbol =
      (unsigned short*)malloc(sizeof(*dest->ll_symbol) * source->size);
  dest->d_symbol =
      (unsigned short*)malloc(sizeof(*dest->d_symbol) * source->size);
  dest->ll_counts = (size_t*)malloc(sizeof(*dest->ll_counts) * llsize);
  dest->d_counts = (size_t*)malloc(sizeof(*dest->d_counts) * dsize);

  /* Allocation failed. */
  if (!dest->litlens || !dest->dists) exit(-1);
  if (!dest->pos) exit(-1);
  if (!dest->ll_symbol || !dest->d_symbol) exit(-1);
  if (!dest->ll_counts || !dest->d_counts) exit(-1);

  dest->size = source->size;
  for (i = 0; i < source->size; i++) {
    dest->litlens[i] = source->litlens[i];
    dest->dists[i] = source->dists[i];
    dest->pos[i] = source->pos[i];
    dest->ll_symbol[i] = source->ll_symbol[i];
    dest->d_symbol[i] = source->d_symbol[i];
  }
  for (i = 0; i < llsize; i++) {
    dest->ll_counts[i] = source->ll_counts[i];
  }
  for (i = 0; i < dsize; i++) {
    dest->d_counts[i] = source->d_counts[i];
  }
}